

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

int __thiscall Escape::Graph::copy(Graph *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong __n;
  ulong uVar1;
  VertexIdx *__dest;
  VertexIdx *__dest_00;
  ulong uVar2;
  
  uVar1 = *(ulong *)(dst + 8);
  this->nVertices = *(VertexIdx *)dst;
  this->nEdges = uVar1;
  __n = uVar1 * 8;
  uVar2 = -(ulong)(uVar1 >> 0x3d != 0) | __n;
  __dest = (VertexIdx *)operator_new__(uVar2);
  this->srcs = __dest;
  __dest_00 = (VertexIdx *)operator_new__(uVar2);
  this->dsts = __dest_00;
  if (uVar1 != 0) {
    memmove(__dest,*(void **)(dst + 0x10),__n);
    memmove(__dest_00,*(void **)(dst + 0x18),__n);
  }
  return (int)this;
}

Assistant:

Graph Graph::copy() const {
    Graph ret = newGraph(nVertices, nEdges);
    std::copy(srcs, srcs + nEdges, ret.srcs);
    std::copy(dsts, dsts + nEdges, ret.dsts);
    return ret;
}